

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

void __thiscall Chip8::CPU::dump(CPU *this)

{
  ostream *poVar1;
  long lVar2;
  int i;
  uint uVar3;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"-------- CPU Registers --------");
  std::endl<char,std::char_traits<char>>(poVar1);
  uVar3 = 0;
  for (lVar2 = -4; lVar2 != 0; lVar2 = lVar2 + 1) {
    *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    poVar1 = std::operator<<(&std::cout,0x30);
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 1;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3);
    poVar1 = std::operator<<(poVar1,": 0x");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->_registers[lVar2 + 4]);
    poVar1 = std::operator<<(poVar1," ");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 1;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3 | 4);
    poVar1 = std::operator<<(poVar1,": 0x");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->_registers[lVar2 + 8]);
    poVar1 = std::operator<<(poVar1," ");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 1;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3 | 8);
    poVar1 = std::operator<<(poVar1,": 0x");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->_registers[lVar2 + 0xc]);
    poVar1 = std::operator<<(poVar1," ");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 1;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar3 | 0xc);
    poVar1 = std::operator<<(poVar1,": 0x");
    *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->_registers[lVar2 + 0x10]);
    poVar1 = std::operator<<(poVar1," ");
    std::endl<char,std::char_traits<char>>(poVar1);
    uVar3 = uVar3 + 1;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"pc: 0x");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 3;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->_program_counter);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"ix: 0x");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 3;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->_index_register);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"sp: 0x");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 3;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->_stack_pointer);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"dt: 0x");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->_delay_timer);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"st: 0x");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 2;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)this->_sound_timer);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"-------------------------------");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void CPU::dump() {
        std::cout << "-------- CPU Registers --------" << std::endl;
        for (int i=0; i<4; i++) {
            std::cout << std::hex << std::setfill('0') <<
                std::setw(1) << i + 0  << ": 0x" << std::setw(2) << int(_registers[i+0])  << " " <<
                std::setw(1) << i + 4  << ": 0x" << std::setw(2) << int(_registers[i+4])  << " " <<
                std::setw(1) << i + 8  << ": 0x" << std::setw(2) << int(_registers[i+8])  << " " <<
                std::setw(1) << i + 12 << ": 0x" << std::setw(2) << int(_registers[i+12]) << " " <<
                std::endl;
        }
        std::cout << std::endl;

        std::cout << "pc: 0x" << std::setw(3) << int(_program_counter) << std::endl
                  << "ix: 0x" << std::setw(3) << int(_index_register) << std::endl
                  << "sp: 0x" << std::setw(3) << int(_stack_pointer) << std::endl
                  << "dt: 0x" << std::setw(2) << int(_delay_timer) << std::endl
                  << "st: 0x" << std::setw(2) << int(_sound_timer) << std::endl;

        std::cout << "-------------------------------" << std::endl;
        std::cout << std::endl;
    }